

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O3

void PlayingState::CmdUnWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  shared_ptr<Item> off;
  shared_ptr<Player> player;
  string match;
  stringstream ss;
  Item *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  Player *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  string local_278;
  shared_ptr<Item> local_258;
  shared_ptr<Item> local_248;
  shared_ptr<Item> local_238;
  shared_ptr<Item> local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_200;
  string local_1e0;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  undefined1 *local_180 [2];
  undefined1 local_170 [80];
  ios_base local_120 [264];
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"main","");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"off","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_1a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_218,__l,(allocator_type *)&local_278);
  pcVar1 = (input->_M_dataplus)._M_p;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + input->_M_string_length);
  Utils::FindMatch(&local_1e0,&local_218,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  lVar4 = 0;
  do {
    if (local_170 + lVar4 != *(undefined1 **)((long)local_180 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_180 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  iVar2 = std::__cxx11::string::compare((char *)&local_1e0);
  if (iVar2 == 0) {
    Player::GetMainHand(local_288);
    if (local_298 == (Item *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),"Nothing to unwield",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
    }
    else {
      local_228.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_228.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Player::SetMainHand(local_288,&local_228);
      if (local_228.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_290;
      if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_290->_M_use_count = local_290->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_290->_M_use_count = local_290->_M_use_count + 1;
        }
      }
      ItemContainer::AddItem(&local_288->super_ItemContainer,&local_248);
      if (local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),"Unwielded ",10);
      Item::GetItemName_abi_cxx11_(&local_278,local_298);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1a0 + 0x10),local_278._M_dataplus._M_p,
                          local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
LAB_0014f3af:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_1e0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),"Please indicate <main> or <off> hand",0x24);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      goto LAB_0014f3d1;
    }
    Player::GetOffHand(local_288);
    if (local_298 != (Item *)0x0) {
      local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Player::SetOffHand(local_288,&local_238);
      if (local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_290;
      if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_290->_M_use_count = local_290->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_290->_M_use_count = local_290->_M_use_count + 1;
        }
      }
      ItemContainer::AddItem(&local_288->super_ItemContainer,&local_258);
      if (local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 0x10),"Unwielded ",10);
      Item::GetItemName_abi_cxx11_(&local_278,local_298);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1a0 + 0x10),local_278._M_dataplus._M_p,
                          local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,Format::NL_abi_cxx11_._M_dataplus._M_p,
                 Format::NL_abi_cxx11_._M_string_length);
      goto LAB_0014f3af;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 0x10),"Nothing to unwield",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 0x10),Format::NL_abi_cxx11_._M_dataplus._M_p,
               Format::NL_abi_cxx11_._M_string_length);
  }
  if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
  }
LAB_0014f3d1:
  std::__cxx11::stringbuf::str();
  (**(local_288->super_Entity)._vptr_Entity)(local_288,local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
  }
  return;
}

Assistant:

void PlayingState::CmdUnWield(const std::string &input, std::shared_ptr<Connection> connection,
                              std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto match = Utils::FindMatch({"main", "off"}, input);
    std::stringstream ss;
    if(match == "main") {
        auto main = player->GetMainHand();
        if (main != nullptr) {
            player->SetMainHand(nullptr);
            player->AddItem(main);
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else if(match == "off") {
        auto off = player->GetOffHand();
        if(off != nullptr) {
            player->SetOffHand(nullptr);
            player->AddItem(off);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else {
        ss << "Please indicate <main> or <off> hand" << Format::NL;
    }
    player->Send(ss.str());
}